

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlFileWrite(void *context,char *buffer,int len)

{
  xmlParserErrors xVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  FILE *file;
  
  iVar2 = -1;
  if (buffer != (char *)0x0 && context != (void *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    sVar4 = fwrite(buffer,1,(long)len,(FILE *)context);
    iVar2 = len;
    if (sVar4 < (ulong)(long)len) {
      xVar1 = xmlIOErr(*piVar3);
      iVar2 = -xVar1;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlFileWrite(void *context, const char *buffer, int len) {
    FILE *file = context;
    size_t bytes;

    if ((context == NULL) || (buffer == NULL))
        return(-1);

    errno = 0;
    bytes = fwrite(buffer, 1, len, file);
    if (bytes < (size_t) len)
        return(-xmlIOErr(errno));

    return(len);
}